

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cross_entropy_loss_test.cc
# Opt level: O0

void __thiscall
xLearn::CROSS_ENTROPY_LOSS_Evalute_Test::TestBody(CROSS_ENTROPY_LOSS_Evalute_Test *this)

{
  bool bVar1;
  ulong uVar2;
  size_type sVar3;
  reference pvVar4;
  ThreadPool *this_00;
  char *pcVar5;
  char *message;
  vector<float,_std::allocator<float>_> *this_01;
  vector<float,_std::allocator<float>_> *pvVar6;
  real_t rVar7;
  AssertionResult gtest_ar_1;
  int i_3;
  int i_2;
  ThreadPool *in_stack_000000a0;
  Score *in_stack_000000a8;
  Loss *in_stack_000000b0;
  AssertionResult gtest_ar;
  real_t val;
  ThreadPool *pool;
  size_t threadNumber;
  Score *score;
  CrossEntropyLoss loss;
  int i_1;
  vector<float,_std::allocator<float>_> label;
  int i;
  vector<float,_std::allocator<float>_> pred;
  undefined4 in_stack_fffffffffffffe90;
  undefined4 in_stack_fffffffffffffe94;
  allocator_type *in_stack_fffffffffffffea0;
  size_type in_stack_fffffffffffffea8;
  undefined4 in_stack_fffffffffffffeb0;
  undefined4 in_stack_fffffffffffffeb4;
  AssertHelper local_108;
  Message local_100;
  undefined8 local_f8;
  AssertionResult local_f0;
  int local_e0;
  int local_dc;
  AssertHelper local_d8;
  Message local_d0;
  undefined8 local_c8;
  double *in_stack_ffffffffffffff40;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_stack_ffffffffffffff48;
  undefined4 in_stack_ffffffffffffff50;
  Loss local_90;
  int local_58;
  vector<float,_std::allocator<float>_> local_50;
  int local_38;
  vector<float,_std::allocator<float>_> local_20;
  
  std::allocator<float>::allocator((allocator<float> *)0x1849ec);
  std::vector<float,_std::allocator<float>_>::vector
            ((vector<float,_std::allocator<float>_> *)
             CONCAT44(in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0),in_stack_fffffffffffffea8
             ,in_stack_fffffffffffffea0);
  std::allocator<float>::~allocator((allocator<float> *)0x184a12);
  for (local_38 = 0; uVar2 = (ulong)local_38,
      sVar3 = std::vector<float,_std::allocator<float>_>::size(&local_20), uVar2 < sVar3;
      local_38 = local_38 + 1) {
    pvVar4 = std::vector<float,_std::allocator<float>_>::operator[](&local_20,(long)local_38);
    *pvVar4 = 10000.0;
  }
  this_00 = (ThreadPool *)(ulong)kLine;
  std::allocator<float>::allocator((allocator<float> *)0x184abb);
  std::vector<float,_std::allocator<float>_>::vector
            ((vector<float,_std::allocator<float>_> *)
             CONCAT44(in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0),in_stack_fffffffffffffea8
             ,in_stack_fffffffffffffea0);
  std::allocator<float>::~allocator((allocator<float> *)0x184ae1);
  local_58 = 0;
  while( true ) {
    uVar2 = (ulong)local_58;
    sVar3 = std::vector<float,_std::allocator<float>_>::size(&local_50);
    if (sVar3 <= uVar2) break;
    pvVar4 = std::vector<float,_std::allocator<float>_>::operator[](&local_50,(long)local_58);
    *pvVar4 = 1.0;
    local_58 = local_58 + 1;
  }
  CrossEntropyLoss::CrossEntropyLoss
            ((CrossEntropyLoss *)CONCAT44(in_stack_fffffffffffffe94,in_stack_fffffffffffffe90));
  operator_new(0x58);
  FMScore::FMScore((FMScore *)CONCAT44(in_stack_fffffffffffffe94,in_stack_fffffffffffffe90));
  std::thread::hardware_concurrency();
  pcVar5 = (char *)operator_new(0x120);
  ThreadPool::ThreadPool(this_00,uVar2);
  Loss::Initialize(in_stack_000000b0,in_stack_000000a8,in_stack_000000a0,i_2._3_1_,i_2._2_1_,i_3);
  CrossEntropyLoss::Evalute
            ((CrossEntropyLoss *)loss.super_Loss._40_8_,
             (vector<float,_std::allocator<float>_> *)loss.super_Loss.threadNumber_,
             (vector<float,_std::allocator<float>_> *)loss.super_Loss.pool_);
  rVar7 = Loss::GetLoss(&local_90);
  local_c8 = 0x3eb0c6f7a0b5ed8d;
  testing::internal::CmpHelperLT<float,double>
            (pcVar5,(char *)CONCAT44(rVar7,in_stack_ffffffffffffff50),
             (float *)in_stack_ffffffffffffff48.ptr_,in_stack_ffffffffffffff40);
  bVar1 = testing::AssertionResult::operator_cast_to_bool
                    ((AssertionResult *)&stack0xffffffffffffff40);
  if (!bVar1) {
    testing::Message::Message(&local_d0);
    message = testing::AssertionResult::failure_message((AssertionResult *)0x184d65);
    testing::internal::AssertHelper::AssertHelper
              (&local_d8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/iamrinni[P]xlearn/src/loss/cross_entropy_loss_test.cc"
               ,0x33,message);
    testing::internal::AssertHelper::operator=(&local_d8,&local_d0);
    testing::internal::AssertHelper::~AssertHelper(&local_d8);
    testing::Message::~Message((Message *)0x184dc2);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x184e17);
  local_dc = 0;
  while( true ) {
    this_01 = (vector<float,_std::allocator<float>_> *)(long)local_dc;
    pvVar6 = (vector<float,_std::allocator<float>_> *)
             std::vector<float,_std::allocator<float>_>::size(&local_20);
    if (pvVar6 <= this_01) break;
    pvVar4 = std::vector<float,_std::allocator<float>_>::operator[](&local_20,(long)local_dc);
    *pvVar4 = -10000.0;
    local_dc = local_dc + 1;
  }
  for (local_e0 = 0; uVar2 = (ulong)local_e0,
      sVar3 = std::vector<float,_std::allocator<float>_>::size(&local_50), uVar2 < sVar3;
      local_e0 = local_e0 + 1) {
    pvVar4 = std::vector<float,_std::allocator<float>_>::operator[](&local_50,(long)local_e0);
    *pvVar4 = -1.0;
  }
  CrossEntropyLoss::Evalute
            ((CrossEntropyLoss *)loss.super_Loss._40_8_,
             (vector<float,_std::allocator<float>_> *)loss.super_Loss.threadNumber_,
             (vector<float,_std::allocator<float>_> *)loss.super_Loss.pool_);
  rVar7 = Loss::GetLoss(&local_90);
  local_f8 = 0x3eb0c6f7a0b5ed8d;
  testing::internal::CmpHelperLT<float,double>
            (pcVar5,(char *)CONCAT44(rVar7,in_stack_ffffffffffffff50),
             (float *)in_stack_ffffffffffffff48.ptr_,in_stack_ffffffffffffff40);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_f0);
  if (!bVar1) {
    testing::Message::Message(&local_100);
    pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)0x184fcb);
    testing::internal::AssertHelper::AssertHelper
              (&local_108,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/iamrinni[P]xlearn/src/loss/cross_entropy_loss_test.cc"
               ,0x3d,pcVar5);
    testing::internal::AssertHelper::operator=(&local_108,&local_100);
    testing::internal::AssertHelper::~AssertHelper(&local_108);
    testing::Message::~Message((Message *)0x185017);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x185066);
  CrossEntropyLoss::~CrossEntropyLoss((CrossEntropyLoss *)0x185073);
  std::vector<float,_std::allocator<float>_>::~vector(this_01);
  std::vector<float,_std::allocator<float>_>::~vector(this_01);
  return;
}

Assistant:

TEST(CROSS_ENTROPY_LOSS, Evalute) {
  // Create pred vector
  std::vector<real_t> pred(kLine);
  for (int i = 0; i < pred.size(); ++i) {
    pred[i] = 10000;
  }
  // Create label vector
  std::vector<real_t> label(kLine);
  for (int i = 0; i < label.size(); ++i) {
    label[i] = 1.0;
  }
  // Create loss
  CrossEntropyLoss loss;
  Score* score = new FMScore;
  size_t threadNumber = std::thread::hardware_concurrency();
  ThreadPool* pool = new ThreadPool(threadNumber);
  loss.Initialize(score, pool);
  loss.Evalute(pred, label);
  real_t val = loss.GetLoss();
  EXPECT_LT(val, 0.000001);
  // Test2
  for (int i = 0; i < pred.size(); ++i) {
    pred[i] = -10000;
  }
  for (int i = 0; i < label.size(); ++i) {
    label[i] = -1.0;
  }
  loss.Evalute(pred, label);
  val = loss.GetLoss();
  EXPECT_LT(val, 0.000001);
}